

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O0

void __thiscall
TPZNonLinMultGridAnalysis::TPZNonLinMultGridAnalysis
          (TPZNonLinMultGridAnalysis *this,TPZCompMesh *cmesh)

{
  TPZSolver *pTVar1;
  TPZStack<TPZFMatrix<double>_*,_10> *this_00;
  TPZMatrixSolver<double> *object;
  TPZAutoPointer<TPZMatrix<double>_> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZMatrixSolver<double> *clone;
  TPZStepSolver<double> solver;
  string *in_stack_fffffffffffffe48;
  DecomposeType decomp;
  TPZCompMesh *in_stack_fffffffffffffe50;
  TPZSolutionMatrix *this_01;
  TPZCompMesh *in_stack_fffffffffffffe58;
  TPZStepSolver<double> *in_stack_fffffffffffffe60;
  TPZMatrix<double> *in_stack_fffffffffffffe68;
  TPZCompMesh *in_stack_fffffffffffffe70;
  void **in_stack_fffffffffffffe78;
  TPZLinearAnalysis *in_stack_fffffffffffffe80;
  allocator<char> *__a;
  int *refmat;
  TPZStepSolver<double> *this_02;
  TPZFMatrix<double> *this_03;
  allocator<char> local_41;
  string local_40 [48];
  TPZAutoPointer<TPZMatrix<double>_> *local_10;
  
  local_10 = in_RSI;
  TPZLinearAnalysis::TPZLinearAnalysis
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),(ostream *)in_stack_fffffffffffffe60)
  ;
  (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZNonLinMultGridAnalysis_0252d230;
  this_03 = (TPZFMatrix<double> *)&in_RDI[8].super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  TPZStack<TPZCompMesh_*,_10>::TPZStack((TPZStack<TPZCompMesh_*,_10> *)in_stack_fffffffffffffe60);
  this_02 = (TPZStepSolver<double> *)&in_RDI[8].fWork.fStore;
  TPZStack<TPZFMatrix<double>_*,_10>::TPZStack
            ((TPZStack<TPZFMatrix<double>_*,_10> *)in_stack_fffffffffffffe60);
  refmat = in_RDI[9].fPivot.fExtAlloc;
  TPZStack<TPZMatrixSolver<double>_*,_10>::TPZStack
            ((TPZStack<TPZMatrixSolver<double>_*,_10> *)in_stack_fffffffffffffe60);
  __a = (allocator<char> *)&in_RDI[10].fPivot;
  TPZStack<TPZMatrixSolver<double>_*,_10>::TPZStack
            ((TPZStack<TPZMatrixSolver<double>_*,_10> *)in_stack_fffffffffffffe60);
  in_RDI[0xb].super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  in_RDI[0xb].super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  *(undefined6 *)&in_RDI[0xb].super_TPZMatrix<double>.super_TPZBaseMatrix.field_0x1a = 0;
  in_RDI[0xb].fElem = (double *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
             (char *)refmat,__a);
  TPZCompMesh::SetName(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  decomp = (DecomposeType)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  TPZStack<TPZCompMesh_*,_10>::Push
            ((TPZStack<TPZCompMesh_*,_10> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(local_10,in_stack_fffffffffffffe68);
  TPZStepSolver<double>::TPZStepSolver(this_02,(TPZAutoPointer<TPZMatrix<double>_> *)refmat);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffe50);
  TPZStepSolver<double>::SetDirect((TPZStepSolver<double> *)in_stack_fffffffffffffe50,decomp);
  pTVar1 = TPZStepSolver<double>::Clone(in_stack_fffffffffffffe60);
  if (pTVar1 == (TPZSolver *)0x0) {
    this_00 = (TPZStack<TPZFMatrix<double>_*,_10> *)0x0;
  }
  else {
    this_00 = (TPZStack<TPZFMatrix<double>_*,_10> *)
              __dynamic_cast(pTVar1,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  }
  (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x10])
            (in_RDI,this_00);
  TPZStack<TPZMatrixSolver<double>_*,_10>::Push
            ((TPZStack<TPZMatrixSolver<double>_*,_10> *)this_00,
             (TPZMatrixSolver<double> *)in_stack_fffffffffffffe58);
  this_01 = (TPZSolutionMatrix *)&in_RDI[8].fWork.fStore;
  object = (TPZMatrixSolver<double> *)operator_new(0x90);
  TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_01);
  TPZFMatrix<double>::TPZFMatrix(this_03,in_RDI);
  TPZStack<TPZFMatrix<double>_*,_10>::Push(this_00,(TPZFMatrix<double> *)object);
  TPZStack<TPZMatrixSolver<double>_*,_10>::Push
            ((TPZStack<TPZMatrixSolver<double>_*,_10> *)this_00,object);
  TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)0x1c4b052);
  return;
}

Assistant:

TPZNonLinMultGridAnalysis::TPZNonLinMultGridAnalysis(TPZCompMesh *cmesh) : 
TPZLinearAnalysis(cmesh), fBegin(0), fInit(0) {
	cmesh->SetName("* * * MALHA INICIAL * * *");
	fMeshes.Push(cmesh);
	TPZStepSolver<STATE> solver;
	solver.SetDirect(ELDLt);
	TPZMatrixSolver<STATE> *clone = dynamic_cast<TPZMatrixSolver<STATE> *>(solver.Clone());
	SetSolver(*clone);
	fSolvers.Push(clone);
	fSolutions.Push(new TPZFMatrix<STATE>(fSolution));
	fPrecondition.Push(0);
}